

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldsout.c
# Opt level: O0

uint sysout_loader(char *sysout_file_name,uint sys_size)

{
  int iVar1;
  __off_t _Var2;
  ssize_t sVar3;
  DLword *pDVar4;
  void *__buf;
  DLword *display_addr;
  ulong uVar5;
  uint local_360;
  uint local_35c;
  int j;
  uint i;
  char tmp [200];
  off_t cfp;
  char errmsg [255];
  undefined1 local_180 [8];
  stat stat_buf;
  uint sysout_size;
  size_t lispworld_offset;
  char *lispworld_scratch;
  off_t fptovp_offset;
  uint *fptovp;
  IFPAGE ifpage;
  int sysout;
  uint sys_size_local;
  char *sysout_file_name_local;
  
  tmp[0xc0] = -1;
  tmp[0xc1] = -1;
  tmp[0xc2] = -1;
  tmp[0xc3] = -1;
  tmp[0xc4] = -1;
  tmp[0xc5] = -1;
  tmp[0xc6] = -1;
  tmp[199] = -1;
  ifpage.process_size = sys_size;
  if ((sys_size != 0) && (sys_size < 8)) {
    perror("You have to specify more than 8MB for process size");
    exit(-1);
  }
  if (0x100 < sys_size) {
    perror("256Mb is the maximum legal sysout size.");
    exit(-1);
  }
  ifpage.ndirtypages = open(sysout_file_name,0);
  if (ifpage.ndirtypages == -1) {
    sprintf((char *)&cfp,"sysout_loader: can\'t open sysout file: %s",sysout_file_name);
    perror((char *)&cfp);
    exit(-1);
  }
  _Var2 = lseek(ifpage.ndirtypages,0x200,0);
  if (_Var2 == -1) {
    perror("sysout_loader: can\'t seek to IFPAGE");
    exit(-1);
  }
  sVar3 = read(ifpage.ndirtypages,&fptovp,0xb0);
  if (sVar3 == -1) {
    perror("sysout_loader: can\'t read IFPAGE");
    exit(-1);
  }
  word_swap_page(&fptovp,0x2c);
  if (ifpage.process_size == 0) {
    if (ifpage.nactivepages == 0) {
      ifpage.process_size = 0x40;
    }
    else {
      ifpage.process_size = ifpage.nactivepages;
    }
  }
  if ((ifpage.mdszonelength == 3) || (ifpage.mdszonelength == 4)) {
    if (ifpage.nactivepages != ifpage.process_size) {
      sprintf((char *)&j,
              "\nsysout loader: Error, secondary space in use. You can\'t specify size.\nProcess size = %d\nSys size = %d\n"
              ,(ulong)(uint)ifpage.nactivepages,(ulong)ifpage.process_size);
      fprintf(_stderr,"sysout_loader: You can\'t specify the process size.\n");
      fprintf(_stderr,"Because, secondary space is already used.\n");
      fprintf(_stderr,"(size is %d, you specified %d.)\n",(ulong)(uint)ifpage.nactivepages,
              (ulong)ifpage.process_size);
      exit(-1);
    }
    Storage_expanded = 0;
  }
  else {
    Storage_expanded = 1;
  }
  pDVar4 = (DLword *)mmap((void *)0x0,(ulong)(ifpage.process_size << 0x14),3,0x22,-1,0);
  if (pDVar4 != (DLword *)0xffffffffffffffff) {
    Lisp_world = pDVar4;
    iVar1 = fstat(ifpage.ndirtypages,(stat *)local_180);
    if (iVar1 == -1) {
      perror("sysout_loader: can\'t get sysout file size");
      exit(-1);
    }
    stat_buf.__glibc_reserved[2]._4_4_ = (uint)((long)stat_buf.st_rdev / 0x200 << 1);
    if (ifpage.rversion != 0x15e3) {
      printf("sysout_loader: %s isn\'t a sysout:\nkey is %x, should be %x\n",sysout_file_name,
             (ulong)ifpage.rversion,0x15e3);
      exit(1);
    }
    if ((stat_buf.st_rdev & 0x1ff) != 0) {
      printf("CAUTION::not an integral number of pages.  sysout & 0x1ff = 0x%x\n",
             (ulong)((uint)stat_buf.st_rdev & 0x1ff));
    }
    if (ifpage.dlnilp3 != stat_buf.__glibc_reserved[2]._4_4_ >> 1) {
      printf("sysout_loader:IFPAGE says sysout size is %d\n",(ulong)ifpage.dlnilp3);
      printf("But, sysout size from UNIX is %d\n",(ulong)(stat_buf.__glibc_reserved[2]._4_4_ >> 1));
      exit(-1);
    }
    _Var2 = lseek(ifpage.ndirtypages,((ulong)(ushort)ifpage.miscstackresult - 1) * 0x200 + 4,0);
    if (_Var2 == -1) {
      perror("sysout_loader: can\'t seek to FPTOVP");
      exit(-1);
    }
    __buf = malloc((ulong)(stat_buf.__glibc_reserved[2]._4_4_ * 2 + 4));
    sVar3 = read(ifpage.ndirtypages,__buf,(ulong)(stat_buf.__glibc_reserved[2]._4_4_ << 1));
    if (sVar3 != -1) {
      word_swap_page(__buf,(stat_buf.__glibc_reserved[2]._4_4_ >> 1) + 1);
      display_addr = NativeAligned2FromLAddr(0x120000);
      init_display2(display_addr,0x200000);
      local_35c = 0;
      do {
        if (stat_buf.__glibc_reserved[2]._4_4_ >> 1 <= local_35c) {
          free(__buf);
          flush_display_buffer();
          close(ifpage.ndirtypages);
          return ifpage.process_size;
        }
        if (*(uint *)((long)__buf + (ulong)local_35c * 4) >> 0x10 != 0xffff) {
          if ((ulong)(local_35c << 9) != tmp._192_8_) {
            _Var2 = lseek(ifpage.ndirtypages,(ulong)(local_35c << 9),0);
            if (_Var2 == -1) {
              perror("sysout_loader: can\'t seek sysout file");
              free(__buf);
              exit(-1);
            }
            tmp._192_8_ = ZEXT48(local_35c << 9);
          }
          uVar5 = (ulong)(uint)(*(int *)((long)__buf + (ulong)local_35c * 4) << 9);
          sVar3 = read(ifpage.ndirtypages,(void *)((long)pDVar4 + uVar5),0x200);
          if (sVar3 == -1) {
            printf("sysout_loader: can\'t read sysout file at %d\n",(ulong)local_35c);
            printf("               offset was 0x%zx (0x%x pages).\n",uVar5,
                   (ulong)*(uint *)((long)__buf + (ulong)local_35c * 4));
            perror("read() error was");
            for (local_360 = 0; (int)local_360 < 10; local_360 = local_360 + 1) {
              printf(" %d: 0x%x  ",(ulong)local_360,
                     (ulong)*(uint *)((long)__buf + (long)(int)local_360 * 4));
            }
            free(__buf);
            exit(-1);
          }
          tmp._192_8_ = tmp._192_8_ + 0x200;
          word_swap_page((void *)((long)pDVar4 + uVar5),0x80);
        }
        local_35c = local_35c + 1;
      } while( true );
    }
    perror("sysout_loader: can\'t read FPTOVP");
    free(__buf);
    exit(-1);
  }
  fprintf(_stderr,"sysout_loader: can\'t allocate Lisp %dMBytes VM \n",(ulong)ifpage.process_size);
  exit(-1);
}

Assistant:

unsigned sysout_loader(const char *sysout_file_name, unsigned sys_size) {
  int sysout; /* SysoutFile descriptor */

  IFPAGE ifpage; /* IFPAGE */

#ifdef BIGVM
  /* 1 "cell" per page for 256MB in 512 byte pages */
  unsigned int *fptovp;
#else
  DLword *fptovp; /* FPTOVP */
#endif                /* BIGVM */
  off_t fptovp_offset; /* FPTOVP start offset */

  char *lispworld_scratch; /* scratch area for lispworld */
  size_t lispworld_offset;   /* lispworld offset */

  unsigned sysout_size; /* sysout size in page */
  struct stat stat_buf; /* file stat buf */

  char errmsg[255];
  off_t cfp = -1;  /* tracks current file position in sysout, or -1 */

  /* Checks for specifying the process size (phase I) */
  /* If sys_size == 0 figure out the proper size later */
  if ((sys_size != 0) && (sys_size < DEFAULT_PRIME_SYSOUTSIZE)) {
    perror("You have to specify more than 8MB for process size");
    exit(-1);
  } else if (sys_size > MAX_EXPLICIT_SYSOUTSIZE) {
    perror("256Mb is the maximum legal sysout size.");
    exit(-1);
  }

  /*
   * first read the IFPAGE(InterfacePage)
   */

  /* open SysoutFile */
  sysout = open(sysout_file_name, O_RDONLY);
  if (sysout == -1) {
    sprintf(errmsg, "sysout_loader: can't open sysout file: %s", sysout_file_name);
    perror(errmsg);
    exit(-1);
  }

  /* seek to IFPAGE */
  if (lseek(sysout, IFPAGE_ADDRESS, SEEK_SET) == -1) {
    perror("sysout_loader: can't seek to IFPAGE");
    exit(-1);
  }

  /* reads IFPAGE into scratch_page */
  if (read(sysout, &ifpage, sizeof(IFPAGE)) == -1) {
    perror("sysout_loader: can't read IFPAGE");
    exit(-1);
  }

#ifdef BYTESWAP
  word_swap_page((unsigned short *)&ifpage, (3 + sizeof(IFPAGE)) / 4);
#endif

/* Check the sysout and emulator for compatibility:
       The sysout's ifpage.lversion must be >= LVERSION, and
       the sysout's ifpage.minbversion must be <= MINBVERSION
*/
#ifndef NOVERSION
  if (ifpage.lversion < LVERSION) {
    (void)fprintf(stderr, "Lisp VM is too old for this emulator.\n");
    (void)fprintf(stderr, "(version is %d, must be at least %d.)\n", ifpage.lversion, LVERSION);
    exit(-1);
  }

  if (ifpage.minbversion > MINBVERSION) {
    (void)fprintf(stderr, "Emulator is too old for this Lisp VM.\n");
    (void)fprintf(stderr, "(version is %d, must be at least %d.)\n", MINBVERSION, ifpage.minbversion);
    exit(-1);
  }
#endif /* NOVERSION */

  /* use default or the previous one */
  if (sys_size == 0) {
    if (ifpage.process_size == 0)        /* Pure LISP.SYSOUT */
      sys_size = DEFAULT_MAX_SYSOUTSIZE; /* default for pure SYSOUT */
    else
      sys_size = ifpage.process_size; /* use previous one */
  }

  /* Checks for specifying the process size (phase II) */
  if ((ifpage.storagefullstate == SFS_ARRAYSWITCHED) ||
      (ifpage.storagefullstate == SFS_FULLYSWITCHED)) {
    /* Storage may be allocated from Secondary space */
    /* Therefore you can not change \\DefaultSecondMDSPage */
    if (ifpage.process_size != sys_size) {
      char tmp[200];
      sprintf(tmp,
              "\nsysout loader: Error, secondary space in use. You can't specify size.\nProcess "
              "size = %d\nSys size = %d\n",
              ifpage.process_size, sys_size);
#ifdef DOS
      /* Note that we have an initialized display by now. */
      /* Hence we have to observe the display protocol. */
      VESA_errorexit(tmp);
#else
      (void)fprintf(stderr, "sysout_loader: You can't specify the process size.\n");
      (void)fprintf(stderr, "Because, secondary space is already used.\n");
      (void)fprintf(stderr, "(size is %d, you specified %d.)\n", ifpage.process_size, sys_size);
      exit(-1);
#endif /* DOS */
    }
    /*Can use this sys_size as the process size */
    /* The sys_size should be same as the previous one */
    Storage_expanded = NIL;
  } else { /* assumes that we can expand the process space */
    Storage_expanded = T;
    /* You can use secondary space , though it was STORAGEFULL
       So, STORAGEFULL may be set to NIL later  */
  }

  /* allocate Virtual Memory Space */

  lispworld_scratch = mmap(0, sys_size * MBYTE, PROT_READ|PROT_WRITE, MAP_ANON | MAP_PRIVATE, -1, 0);
  if (lispworld_scratch == MAP_FAILED) {
    (void)fprintf(stderr, "sysout_loader: can't allocate Lisp %dMBytes VM \n", sys_size);
    exit(-1);
  }

  /* now you can access lispworld */
  Lisp_world = (DLword *)lispworld_scratch;

  DBPRINT(("VM allocated = 0x%x at %p\n", sys_size * MBYTE, (void *)Lisp_world));
  DBPRINT(("Native Load Address = 0x%x\n", native_load_address));

  /*
   * get FPTOVP location and SysoutFile size
   */

  /* get FPTOVP location from IFPAGE */
  fptovp_offset = ifpage.fptovpstart;

  DBPRINT(("FPTOVP Location %ld \n", (long)fptovp_offset));

  /* get sysout file size in halfpage(256) */
  if (fstat(sysout, &stat_buf) == -1) {
    perror("sysout_loader: can't get sysout file size");
    exit(-1);
  }
  sysout_size = (unsigned)(stat_buf.st_size / BYTESPER_PAGE * 2);

  DBPRINT(("sysout size / 2 = 0x%x\n", sysout_size / 2));
  DBPRINT(("vmem size = 0x%x\n", ifpage.nactivepages));

  /* do some simple checks to see if this is really a sysout */
  if (ifpage.key != IFPAGE_KEYVAL) {
    printf("sysout_loader: %s isn't a sysout:\nkey is %x, should be %x\n", sysout_file_name,
           ifpage.key, IFPAGE_KEYVAL);
    exit(1);
  }

  if ((stat_buf.st_size & (BYTESPER_PAGE - 1)) != 0)
    printf("CAUTION::not an integral number of pages.  sysout & 0x1ff = 0x%x\n",
           (int)(stat_buf.st_size & (BYTESPER_PAGE - 1)));

  if (ifpage.nactivepages != (sysout_size / 2)) {
    printf("sysout_loader:IFPAGE says sysout size is %d\n", ifpage.nactivepages);
    printf("But, sysout size from UNIX is %d\n", sysout_size / 2);
    exit(-1);
  }

/*
 * Now get FPTOVP
 */

/* seek to FPTOVP */
#ifdef BIGVM
  fptovp_offset = (fptovp_offset - 1) * BYTESPER_PAGE + 4;
#else
  fptovp_offset = (fptovp_offset - 1) * BYTESPER_PAGE + 2;
#endif
  if (lseek(sysout, fptovp_offset, SEEK_SET) == -1) {
    perror("sysout_loader: can't seek to FPTOVP");
    exit(-1);
  }

  /* read FPTOVP */

#ifdef BIGVM
  /* fptovp is now in cells, not words */
  fptovp = malloc(sysout_size * 2 + 4);
  if (read(sysout, fptovp, sysout_size * 2) == -1) {
    perror("sysout_loader: can't read FPTOVP");
    free(fptovp);
    exit(-1);
  }

#ifdef BYTESWAP
  /* So space to swap is twice as big, too. */
  word_swap_page((unsigned short *)fptovp, (sysout_size / 2) + 1);
#endif /* BYTESWAP */

#else

  fptovp = malloc(sysout_size + 2);
  if (read(sysout, fptovp, sysout_size) == -1) {
    perror("sysout_loader: can't read FPTOVP");
    free(fptovp);
    exit(-1);
  }

#ifdef BYTESWAP
  word_swap_page((unsigned short *)fptovp, (sysout_size / 4) + 1);
#endif /* BYTESWAP */

#endif /* BIGVM */

  /*
   * Initialize the display (note now passing 68k address!!!)
   */
  init_display2(NativeAligned2FromLAddr(DISPLAY_OFFSET), 65536 * 16 * 2);

  /* read sysout file to lispworld */

  for (unsigned i = 0; i < (sysout_size / 2); i++) {
#ifdef DOS
    /* Dial that floats from left to right on the top line of the */
    /* displaty. Dial shows % of sysout loaded by digits and */
    /* position. */
    int columns;
    switch (currentdsp->graphicsmode) {
      case 0x104:
        columns = 120; /* 131 - 10 */
        break;
      case 0x102:
        columns = 69; /* 79 - 10 */
        break;
      default:
        columns = 69; /* 79 - 10 */
        break;
    }
    _settextposition((short)0, (short)0);
    if ((i & 0xf) == 0) {
      for (int j = 0; j < (columns * i) / (sysout_size >> 1); j++) putchar(' ');
      printf("-=(%2d%%)=-\n", (100 * i) / (sysout_size >> 1));
    }
#endif /* DOS */
    if (GETPAGEOK(fptovp, i) != 0177777) {
      /* only seek if not already at desired position */
      if (i * BYTESPER_PAGE != cfp) {
	if (lseek(sysout, i * BYTESPER_PAGE, SEEK_SET) == -1) {
	  perror("sysout_loader: can't seek sysout file");
	  free(fptovp);
	  exit(-1);
	}
	cfp = i * BYTESPER_PAGE; /* now at known position */
      }
      lispworld_offset = GETFPTOVP(fptovp, i) * BYTESPER_PAGE;
      if (read(sysout, lispworld_scratch + lispworld_offset, BYTESPER_PAGE) == -1) {
        printf("sysout_loader: can't read sysout file at %d\n", i);
        printf("               offset was 0x%zx (0x%x pages).\n", lispworld_offset,
               GETFPTOVP(fptovp, i));
        perror("read() error was");
        for (int j = 0; j < 10; j++) {
          printf(" %d: 0x%x  ", j, GETFPTOVP(fptovp, j));
        }
        free(fptovp);
        exit(-1);
      }
      cfp += BYTESPER_PAGE; /* new known position */
#ifdef BYTESWAP
      word_swap_page((DLword *)(lispworld_scratch + lispworld_offset), 128);
#endif
    }
  }
  free(fptovp);
  DBPRINT(("sysout file is read completely.\n"));

#if (defined(DISPLAYBUFFER) || defined(XWINDOW) || defined(DOS))
  TPRINT(("Flushing display buffer...\n"));
  flush_display_buffer();
  TPRINT(("After Flushing display buffer\n"));
#endif /* DISPLAYBUFFER || XWINDOW || DOS */

  close(sysout);
  return (sys_size);
}